

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtDumpNode(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  _xmlNode *node_00;
  
  if (node == (xmlNodePtr)0x0) {
    if (ctxt->check == 0) {
      xmlCtxtDumpSpaces(ctxt);
      fwrite("node is NULL\n",0xd,1,(FILE *)ctxt->output);
      return;
    }
  }
  else {
    xmlCtxtDumpOneNode(ctxt,node);
    if ((node->type != XML_NAMESPACE_DECL) &&
       (node_00 = node->children, node->type != XML_ENTITY_REF_NODE && node_00 != (_xmlNode *)0x0))
    {
      ctxt->depth = ctxt->depth + 1;
      do {
        xmlCtxtDumpNode(ctxt,node_00);
        node_00 = node_00->next;
      } while (node_00 != (_xmlNode *)0x0);
      ctxt->depth = ctxt->depth + -1;
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpNode(xmlDebugCtxtPtr ctxt, xmlNodePtr node)
{
    if (node == NULL) {
        if (!ctxt->check) {
            xmlCtxtDumpSpaces(ctxt);
            fprintf(ctxt->output, "node is NULL\n");
        }
        return;
    }
    xmlCtxtDumpOneNode(ctxt, node);
    if ((node->type != XML_NAMESPACE_DECL) &&
        (node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
        ctxt->depth++;
        xmlCtxtDumpNodeList(ctxt, node->children);
        ctxt->depth--;
    }
}